

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void printXMLOption(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  TidyConfigCategory TVar1;
  OptionDesc *d_local;
  TidyOption topt_local;
  TidyDoc tdoc_local;
  
  TVar1 = tidyOptGetCategory(topt);
  if (TVar1 != TidyInternalCategory) {
    printf(" <option class=\"%s\">\n",d->cat);
    printf("  <name>%s</name>\n",d->name);
    printf("  <type>%s</type>\n",d->type);
    if (d->def == (ctmbstr)0x0) {
      printf("  <default />\n");
    }
    else {
      printf("  <default>%s</default>\n",d->def);
    }
    if (d->haveVals == no) {
      printf("  <example />\n");
    }
    else {
      printf("  <example>");
      PrintAllowedValues(topt,d);
      printf("</example>\n");
    }
    printXMLDescription(tdoc,topt);
    printXMLCrossRef(tdoc,topt);
    printXMLCrossRefEqConsole(tdoc,topt);
    printf(" </option>\n");
  }
  return;
}

Assistant:

static void printXMLOption(TidyDoc tdoc,    /**< The Tidy document. */
                           TidyOption topt, /**< The option. */
                           OptionDesc *d    /**< The OptionDesc for the option. */
                           )
{
    if ( tidyOptGetCategory(topt) == TidyInternalCategory )
        return;

    printf( " <option class=\"%s\">\n", d->cat );
    printf  ("  <name>%s</name>\n",d->name);
    printf  ("  <type>%s</type>\n",d->type);
    if (d->def)
        printf("  <default>%s</default>\n",d->def);
    else
        printf("  <default />\n");
    if (d->haveVals)
    {
        printf("  <example>");
        PrintAllowedValues( topt, d );
        printf("</example>\n");
    }
    else
    {
        printf("  <example />\n");
    }
    printXMLDescription( tdoc, topt );
    printXMLCrossRef( tdoc, topt );
    printXMLCrossRefEqConsole( tdoc, topt );
    printf( " </option>\n" );
}